

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall tinyusdz::ascii::AsciiParser::ParseStageMetas(AsciiParser *this)

{
  StreamReader *pSVar1;
  bool bVar2;
  ulong uVar3;
  byte unaff_BPL;
  char c;
  char local_19;
  
  bVar2 = Expect(this,'(');
  if ((bVar2) && (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), bVar2)) {
    do {
      pSVar1 = this->_sr;
      if (pSVar1->length_ <= pSVar1->idx_) {
        return true;
      }
      if (pSVar1->binary_[pSVar1->idx_] == '\0') {
        return true;
      }
      bVar2 = LookChar1(this,&local_19);
      if (bVar2) {
        if (local_19 == ')') {
          pSVar1 = this->_sr;
          uVar3 = pSVar1->idx_ + 1;
          if (pSVar1->length_ < uVar3) goto LAB_003ea431;
          pSVar1->idx_ = uVar3;
          unaff_BPL = SkipCommentAndWhitespaceAndNewline(this,true);
          goto LAB_003ea433;
        }
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        if ((!bVar2) || (bVar2 = ParseStageMetaOpt(this), !bVar2)) goto LAB_003ea431;
        bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
        unaff_BPL = unaff_BPL & bVar2;
      }
      else {
LAB_003ea431:
        unaff_BPL = false;
LAB_003ea433:
        bVar2 = false;
      }
    } while (bVar2 != false);
  }
  else {
    unaff_BPL = false;
  }
  return (bool)unaff_BPL;
}

Assistant:

bool AsciiParser::ParseStageMetas() {
  if (!Expect('(')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  while (!Eof()) {
    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == ')') {
      if (!SeekTo(CurrLoc() + 1)) {
        return false;
      }

      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      DCOUT("Stage metas end");

      // end
      return true;

    } else {
      if (!SkipCommentAndWhitespaceAndNewline()) {
        // eof
        return false;
      }

      if (!ParseStageMetaOpt()) {
        // parse error
        return false;
      }
    }

    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }
  }

  DCOUT("ParseStageMetas end");
  return true;
}